

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  BYTE *ofCodeTable_local;
  FSE_CTable *CTable_OffsetBits_local;
  BYTE *mlCodeTable_local;
  FSE_CTable *CTable_MatchLength_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (bmi2 == 0) {
    dst_local = (void *)ZSTD_encodeSequences_default
                                  (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,
                                   ofCodeTable,CTable_LitLength,llCodeTable,sequences,nbSeq,
                                   longOffsets);
  }
  else {
    dst_local = (void *)ZSTD_encodeSequences_bmi2
                                  (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,
                                   ofCodeTable,CTable_LitLength,llCodeTable,sequences,nbSeq,
                                   longOffsets);
  }
  return (size_t)dst_local;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}